

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkFraigTrust(Abc_Ntk_t *pNtk)

{
  uint *puVar1;
  ulong uVar2;
  Abc_Aig_t *pMan;
  ulong uVar3;
  long lVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Abc_Obj_t *pAVar9;
  Abc_Ntk_t *pNtkNew;
  Vec_Ptr_t *p;
  ProgressBar *p_00;
  long *plVar10;
  char *pString;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *paVar11;
  int i;
  int iVar12;
  char *__s;
  long lVar13;
  
  if ((pNtk->ntkFunc == ABC_FUNC_SOP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    for (iVar12 = 0; iVar12 < pNtk->vObjs->nSize; iVar12 = iVar12 + 1) {
      pAVar9 = Abc_NtkObj(pNtk,iVar12);
      if ((((pAVar9 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar9->field_0x14 & 0xf) == 7)) &&
          (iVar6 = (pAVar9->vFanins).nSize, 1 < iVar6)) &&
         (((iVar6 != 2 || (iVar6 = Abc_SopIsAndType((char *)(pAVar9->field_5).pData), iVar6 == 0))
          && (iVar6 = Abc_SopIsOrType((char *)(pAVar9->field_5).pData), iVar6 == 0)))) {
        __s = "Abc_NtkFraigTrust: The network does not look like an AIG with choice nodes.";
        goto LAB_0023a781;
      }
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    p = Abc_NtkDfs(pNtk,0);
    p_00 = Extra_ProgressBarStart(_stdout,p->nSize);
    for (iVar12 = 0; iVar12 < p->nSize; iVar12 = iVar12 + 1) {
      plVar10 = (long *)Vec_PtrEntry(p,iVar12);
      Extra_ProgressBarUpdate(p_00,iVar12,pString);
      if ((*(uint *)((long)plVar10 + 0x14) & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                      ,0x23d,"void Abc_NtkFraigTrustOne(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      iVar6 = *(int *)((long)plVar10 + 0x1c);
      iVar7 = Abc_SopGetVarNum((char *)plVar10[7]);
      if (iVar6 != iVar7) {
        __assert_fail("nFanins == Abc_SopGetVarNum((char *)pNode->pData)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                      ,0x262,"Abc_Obj_t *Abc_NodeFraigTrust(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      if (iVar6 == 2) {
        iVar6 = Abc_SopIsAndType((char *)plVar10[7]);
        if (iVar6 == 0) {
LAB_0023a935:
          iVar6 = Abc_SopIsOrType((char *)plVar10[7]);
          if (iVar6 == 0) {
            __assert_fail("Abc_SopIsOrType((char *)pNode->pData)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                          ,0x26c,"Abc_Obj_t *Abc_NodeFraigTrust(Abc_Ntk_t *, Abc_Obj_t *)");
          }
          iVar6 = Abc_SopGetIthCareLit((char *)plVar10[7],0);
          pAVar9 = *(Abc_Obj_t **)
                    (*(long *)(*(long *)(*(long *)(*plVar10 + 0x20) + 8) +
                              (long)*(int *)plVar10[4] * 8) + 0x40);
          paVar11 = &pAVar9->field_5;
          for (lVar13 = 0; lVar13 < *(int *)((long)plVar10 + 0x1c); lVar13 = lVar13 + 1) {
            if (lVar13 != 0) {
              lVar4 = *(long *)(*(long *)(*(long *)(*plVar10 + 0x20) + 8) +
                               (long)*(int *)(plVar10[4] + lVar13 * 4) * 8);
              pvVar5 = *(void **)(lVar4 + 0x40);
              paVar11->pData = pvVar5;
              paVar11 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 *)((long)pvVar5 + 0x38);
              iVar7 = Abc_SopGetIthCareLit((char *)plVar10[7],(int)lVar13);
              if (iVar6 != iVar7) {
                puVar1 = (uint *)(*(long *)(lVar4 + 0x40) + 0x14);
                *puVar1 = *puVar1 | 0x80;
              }
            }
          }
          if (paVar11->pData != (void *)0x0) {
            __assert_fail("*ppTail == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                          ,0x27c,"Abc_Obj_t *Abc_NodeFraigTrust(Abc_Ntk_t *, Abc_Obj_t *)");
          }
        }
        else {
          pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
          uVar2 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar10 + 0x20) + 8) +
                                      (long)*(int *)plVar10[4] * 8) + 0x40);
          iVar6 = Abc_SopGetIthCareLit((char *)plVar10[7],0);
          uVar3 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar10 + 0x20) + 8) +
                                      (long)*(int *)(plVar10[4] + 4) * 8) + 0x40);
          iVar7 = Abc_SopGetIthCareLit((char *)plVar10[7],1);
          pAVar9 = Abc_AigAnd(pMan,(Abc_Obj_t *)(iVar6 == 0 ^ uVar2),
                              (Abc_Obj_t *)(iVar7 == 0 ^ uVar3));
        }
      }
      else if (iVar6 == 1) {
        uVar2 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar10 + 0x20) + 8) +
                                    (long)*(int *)plVar10[4] * 8) + 0x40);
        iVar6 = Abc_SopIsInv((char *)plVar10[7]);
        pAVar9 = (Abc_Obj_t *)(iVar6 != 0 ^ uVar2);
      }
      else {
        if (iVar6 != 0) goto LAB_0023a935;
        pAVar9 = Abc_AigConst1(pNtkNew);
        iVar6 = Abc_SopIsConst0((char *)plVar10[7]);
        pAVar9 = (Abc_Obj_t *)((ulong)(iVar6 != 0) ^ (ulong)pAVar9);
      }
      if (pNtk->ntkType == ABC_NTK_NETLIST) {
        plVar10 = *(long **)(*(long *)(*(long *)(*plVar10 + 0x20) + 8) +
                            (long)*(int *)plVar10[6] * 8);
      }
      if (plVar10[8] != 0) {
        __assert_fail("pObj->pCopy == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFraig.c"
                      ,0x246,"void Abc_NtkFraigTrustOne(Abc_Ntk_t *, Abc_Ntk_t *)");
      }
      plVar10[8] = (long)pAVar9;
    }
    Vec_PtrFree(p);
    Extra_ProgressBarStop(p_00);
    Abc_NtkFinalize(pNtk,pNtkNew);
    Abc_NtkReassignIds(pNtkNew);
    uVar8 = Abc_NtkGetChoiceNum(pNtkNew);
    printf("Warning: The resulting AIG contains %d choice nodes.\n",(ulong)uVar8);
    iVar12 = Abc_NtkCheck(pNtkNew);
    if (iVar12 != 0) {
      return pNtkNew;
    }
    puts("Abc_NtkFraigTrust: The network check has failed.");
    Abc_NtkDelete(pNtkNew);
  }
  else {
    __s = "Abc_NtkFraigTrust: Trust mode works for netlists and logic SOP networks.";
LAB_0023a781:
    puts(__s);
  }
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Abc_NtkFraigTrust( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;

    if ( !Abc_NtkIsSopLogic(pNtk) )
    {
        printf( "Abc_NtkFraigTrust: Trust mode works for netlists and logic SOP networks.\n" );
        return NULL;
    }

    if ( !Abc_NtkFraigTrustCheck(pNtk) )
    {
        printf( "Abc_NtkFraigTrust: The network does not look like an AIG with choice nodes.\n" );
        return NULL;
    }
    
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    Abc_NtkFraigTrustOne( pNtk, pNtkNew );
    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkReassignIds( pNtkNew );

    // print a warning about choice nodes
    printf( "Warning: The resulting AIG contains %d choice nodes.\n", Abc_NtkGetChoiceNum( pNtkNew ) );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkFraigTrust: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}